

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

bool __thiscall Cache::cacheSetFull(Cache *this,uint32_t set_id)

{
  uint uVar1;
  const_reference pvVar2;
  int in_ESI;
  long in_RDI;
  uint32_t i;
  uint32_t end;
  uint32_t begin;
  uint local_20;
  
  local_20 = in_ESI * *(int *)(in_RDI + 0x3c);
  uVar1 = local_20 + *(int *)(in_RDI + 0x3c);
  while( true ) {
    if (uVar1 <= local_20) {
      return true;
    }
    pvVar2 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                        (ulong)local_20);
    if ((pvVar2->valid & 1U) == 0) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool Cache::cacheSetFull(uint32_t set_id) const {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return false;
    }
    return true;
}